

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::testGroupStarting(JunitReporter *this,GroupInfo *groupInfo)

{
  timeval t;
  timeval local_30;
  long local_20 [2];
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  (this->suiteTimer).m_ticks = local_30.tv_sec * 1000000 + local_30.tv_usec;
  local_30.tv_sec = (__time_t)local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x118);
  if ((long *)local_30.tv_sec != local_20) {
    operator_delete((void *)local_30.tv_sec,local_20[0] + 1);
  }
  local_30.tv_sec = (__time_t)local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x290);
  if ((long *)local_30.tv_sec != local_20) {
    operator_delete((void *)local_30.tv_sec,local_20[0] + 1);
  }
  this->unexpectedExceptions = 0;
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) {
            suiteTimer.start();
            stdOutForSuite.str("");
            stdErrForSuite.str("");
            unexpectedExceptions = 0;
            CumulativeReporterBase::testGroupStarting( groupInfo );
        }